

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::shaderexecutor::PackUnorm4x8Case::createInstance(PackUnorm4x8Case *this,Context *ctx)

{
  PackUnorm4x8CaseInstance *this_00;
  
  this_00 = (PackUnorm4x8CaseInstance *)operator_new(0xb0);
  PackUnorm4x8CaseInstance::PackUnorm4x8CaseInstance
            (this_00,ctx,(this->super_ShaderPackingFunctionCase).m_shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,this->m_precision,
             (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_name._M_dataplus._M_p);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new PackUnorm4x8CaseInstance(ctx, m_shaderType, m_spec, m_precision, getName());
	}